

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::setBackground(QMdiArea *this,QBrush *brush)

{
  bool bVar1;
  QMdiAreaPrivate *pQVar2;
  QBrush *in_RSI;
  QMdiAreaPrivate *d;
  bool in_stack_00000043;
  WidgetAttribute in_stack_00000044;
  QWidget *in_stack_00000048;
  QWidget *in_stack_ffffffffffffffd8;
  QBrush *in_stack_ffffffffffffffe0;
  
  pQVar2 = d_func((QMdiArea *)0x612e4c);
  bVar1 = QBrush::operator!=(in_stack_ffffffffffffffe0,(QBrush *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    QBrush::operator=(&pQVar2->background,in_RSI);
    QBrush::isOpaque();
    QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
    QWidget::update(in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QMdiArea::setBackground(const QBrush &brush)
{
    Q_D(QMdiArea);
    if (d->background != brush) {
        d->background = brush;
        d->viewport->setAttribute(Qt::WA_OpaquePaintEvent, brush.isOpaque());
        d->viewport->update();
    }
}